

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataExtractor.cpp
# Opt level: O0

void __thiscall llvm::DataExtractor::skip(DataExtractor *this,Cursor *C,uint64_t Length)

{
  bool bVar1;
  ErrorAsOutParameter local_28;
  ErrorAsOutParameter ErrAsOut;
  uint64_t Length_local;
  Cursor *C_local;
  DataExtractor *this_local;
  
  ErrAsOut.Err = (Error *)Length;
  ErrorAsOutParameter::ErrorAsOutParameter(&local_28,&C->Err);
  bVar1 = isError(&C->Err);
  if (!bVar1) {
    bVar1 = isValidOffsetForDataOfSize(this,C->Offset,(uint64_t)ErrAsOut.Err);
    if (bVar1) {
      C->Offset = (long)&(ErrAsOut.Err)->Payload + C->Offset;
    }
    else {
      unexpectedEndReached(&C->Err);
    }
  }
  ErrorAsOutParameter::~ErrorAsOutParameter(&local_28);
  return;
}

Assistant:

void DataExtractor::skip(Cursor &C, uint64_t Length) const {
  ErrorAsOutParameter ErrAsOut(&C.Err);
  if (isError(&C.Err))
    return;

  if (isValidOffsetForDataOfSize(C.Offset, Length))
    C.Offset += Length;
  else
    unexpectedEndReached(&C.Err);
}